

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O3

void __thiscall EOClient::~EOClient(EOClient *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Player *this_00;
  pointer pcVar2;
  
  (this->super_Client)._vptr_Client = (_func_int **)&PTR_NeedTick_001d1560;
  if ((FILE *)this->upload_fh != (FILE *)0x0) {
    fclose((FILE *)this->upload_fh);
  }
  this_00 = this->player;
  if (this_00 != (Player *)0x0) {
    Player::~Player(this_00);
    operator_delete(this_00,0x80);
  }
  pcVar2 = (this->data)._M_dataplus._M_p;
  paVar1 = &(this->data).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ActionQueue::~ActionQueue(&this->queue);
  pcVar2 = (this->send_buffer2)._M_dataplus._M_p;
  paVar1 = &(this->send_buffer2).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Client::~Client(&this->super_Client);
  return;
}

Assistant:

EOClient::~EOClient()
{
	if (this->upload_fh)
	{
		std::fclose(this->upload_fh);
	}

	if (this->player)
	{
		delete this->player;
	}
}